

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

FIOBJ fiobj_str_new(char *str,size_t len)

{
  byte bVar1;
  char *pcVar2;
  undefined1 *puVar3;
  FIOBJ extraout_RAX;
  FIOBJ FVar4;
  uint64_t uVar5;
  ulong uVar6;
  void *pvVar7;
  size_t in_RCX;
  void *__src;
  uint8_t *puVar8;
  fio_str_s_conflict *s;
  uint64_t *puVar9;
  undefined1 *__dest;
  ulong needed;
  fio_str_info_s fStack_78;
  fio_str_info_s local_30;
  
  puVar9 = (uint64_t *)0x40;
  s = (fio_str_s_conflict *)len;
  puVar3 = (undefined1 *)fio_malloc(0x40);
  if (puVar3 != (undefined1 *)0x0) {
    *puVar3 = 0x28;
    *(undefined4 *)(puVar3 + 4) = 1;
    *(undefined8 *)(puVar3 + 8) = 0;
    puVar3[0x10] = 1;
    *(undefined8 *)(puVar3 + 0x11) = 0;
    *(undefined8 *)(puVar3 + 0x19) = 0;
    *(undefined8 *)(puVar3 + 0x21) = 0;
    *(undefined8 *)(puVar3 + 0x29) = 0;
    *(undefined8 *)(puVar3 + 0x30) = 0;
    *(undefined8 *)(puVar3 + 0x38) = 0;
    if ((len != 0 && str != (char *)0x0) && (puVar3[0x11] == '\0')) {
      if (len < 0x2e) {
        puVar3[0x10] = (char)len * '\x02' + '\x01';
        __dest = puVar3 + 0x12;
        puVar3[len + 0x12] = 0;
      }
      else {
        puVar3[0x10] = 0x5b;
        fio_str_capa_assert(&local_30,(fio_str_s_conflict *)(puVar3 + 0x10),len);
        *(size_t *)(puVar3 + 0x28) = len;
        *(undefined1 *)(*(long *)(puVar3 + 0x38) + len) = 0;
        __dest = *(undefined1 **)(puVar3 + 0x38);
      }
      memcpy(__dest,str,len);
    }
    return (ulong)puVar3 | 2;
  }
  fiobj_str_new_cold_1();
  if (((__src == (void *)0x0) || (s == (fio_str_s_conflict *)0x0)) || (in_RCX == 0)) {
    if (s == (fio_str_s_conflict *)0x0) {
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9[2] = 0;
      return extraout_RAX;
    }
LAB_0014432d:
    bVar1 = s->small;
    if ((bVar1 == 0) && (pcVar2 = s->data, pcVar2 != (char *)0x0)) {
      if (s->frozen == '\0') {
        uVar5 = s->capa;
      }
      else {
        uVar5 = 0;
      }
      *puVar9 = uVar5;
      FVar4 = s->len;
      puVar9[1] = FVar4;
      puVar9[2] = (uint64_t)pcVar2;
    }
    else {
      uVar5 = 0x2d;
      if (s->frozen != '\0') {
        uVar5 = 0;
      }
      *puVar9 = uVar5;
      FVar4 = (FIOBJ)(bVar1 >> 1);
      puVar9[1] = FVar4;
      puVar9[2] = (uint64_t)s->reserved;
    }
    return FVar4;
  }
  if (s->frozen != '\0') goto LAB_0014432d;
  if (s->small == 0) {
    needed = in_RCX;
    if (s->data == (char *)0x0) goto LAB_001442f8;
    needed = s->len + in_RCX;
    uVar6 = s->capa;
    if (uVar6 <= needed) {
      if (s->dealloc == (_func_void_void_ptr *)0x0) {
        uVar6 = s->len;
      }
      s->len = uVar6;
      goto LAB_001443ba;
    }
  }
  else {
    needed = (s->small >> 1) + in_RCX;
LAB_001442f8:
    if (needed < 0x2e) {
      s->small = (char)needed * '\x02' + '\x01';
      s->reserved[needed] = '\0';
      puVar8 = s->reserved;
      *puVar9 = 0x2d;
      puVar9[1] = needed;
      goto LAB_001443e6;
    }
    s->small = '[';
LAB_001443ba:
    fio_str_capa_assert(&fStack_78,s,needed);
  }
  s->len = needed;
  s->data[needed] = '\0';
  *puVar9 = s->capa;
  puVar9[1] = needed;
  puVar8 = (uint8_t *)s->data;
LAB_001443e6:
  puVar9[2] = (uint64_t)puVar8;
  pvVar7 = memcpy(puVar8 + (needed - in_RCX),__src,in_RCX);
  return (FIOBJ)pvVar7;
}

Assistant:

FIOBJ fiobj_str_new(const char *str, size_t len) {
  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT,
  };
  if (str && len) {
    fio_str_write(&s->str, str, len);
  }
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}